

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
DenseHashMapMoveTest_CBeginCEnd_Test::TestBody(DenseHashMapMoveTest_CBeginCEnd_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *__i;
  pointer lhs_expression;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  cit end;
  cit begin;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  const_iterator it;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  h;
  bool *in_stack_fffffffffffffd88;
  undefined2 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd92;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffd93;
  undefined1 in_stack_fffffffffffffd94;
  undefined1 uVar6;
  undefined1 in_stack_fffffffffffffd95;
  undefined1 in_stack_fffffffffffffd96;
  undefined1 uVar7;
  undefined1 in_stack_fffffffffffffd97;
  key_equal *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  undefined1 uVar8;
  size_type in_stack_fffffffffffffda8;
  int line;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffdb0;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> *this_00;
  Type type;
  AssertHelper *in_stack_fffffffffffffdc0;
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffdf0;
  pointer in_stack_fffffffffffffdf8;
  pointer in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  undefined1 uVar9;
  AssertHelper *in_stack_fffffffffffffe10;
  string local_1e0 [48];
  const_iterator local_1b0;
  undefined1 local_191;
  AssertionResult local_190;
  iterator local_180;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_168;
  iterator local_150;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_138;
  string local_120 [48];
  const_iterator local_f0;
  undefined1 local_d1;
  AssertionResult local_d0;
  uint local_bc;
  undefined4 local_a4;
  AssertionResult local_a0;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_90;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> local_5b [91];
  
  this_00 = local_5b;
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::libc_allocator_with_realloc
            (this_00);
  type = (Type)((ulong)this_00 >> 0x20);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::dense_hash_map(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                   (hasher *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                   in_stack_fffffffffffffd98,
                   (allocator_type *)
                   CONCAT17(in_stack_fffffffffffffd97,
                            CONCAT16(in_stack_fffffffffffffd96,
                                     CONCAT15(in_stack_fffffffffffffd95,
                                              CONCAT14(in_stack_fffffffffffffd94,
                                                       CONCAT13(in_stack_fffffffffffffd93,
                                                                CONCAT12(in_stack_fffffffffffffd92,
                                                                         in_stack_fffffffffffffd90))
                                                      )))));
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc
            (local_5b);
  local_70 = 0;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::set_empty_key((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *)CONCAT17(in_stack_fffffffffffffd97,
                              CONCAT16(in_stack_fffffffffffffd96,
                                       CONCAT15(in_stack_fffffffffffffd95,
                                                CONCAT14(in_stack_fffffffffffffd94,
                                                         CONCAT13(in_stack_fffffffffffffd93,
                                                                  CONCAT12(in_stack_fffffffffffffd92
                                                                           ,
                                                  in_stack_fffffffffffffd90)))))),
                  (key_type *)in_stack_fffffffffffffd88);
  local_74 = 0xffffffff;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::set_deleted_key((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)CONCAT17(in_stack_fffffffffffffd97,
                                CONCAT16(in_stack_fffffffffffffd96,
                                         CONCAT15(in_stack_fffffffffffffd95,
                                                  CONCAT14(in_stack_fffffffffffffd94,
                                                           CONCAT13(in_stack_fffffffffffffd93,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffd92,
                                                  in_stack_fffffffffffffd90)))))),
                    (key_type *)in_stack_fffffffffffffd88);
  local_78 = 1;
  __i = (dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)google::
           dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           ::operator[]((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)CONCAT17(in_stack_fffffffffffffd97,
                                    CONCAT16(in_stack_fffffffffffffd96,
                                             CONCAT15(in_stack_fffffffffffffd95,
                                                      CONCAT14(in_stack_fffffffffffffd94,
                                                               CONCAT13(in_stack_fffffffffffffd93,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffd92,
                                                  in_stack_fffffffffffffd90)))))),
                        (key_type *)in_stack_fffffffffffffd88);
  *(data_type *)&__i->ht = 1;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::cbegin((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *)CONCAT17(in_stack_fffffffffffffd97,
                       CONCAT16(in_stack_fffffffffffffd96,
                                CONCAT15(in_stack_fffffffffffffd95,
                                         CONCAT14(in_stack_fffffffffffffd94,
                                                  CONCAT13(in_stack_fffffffffffffd93,
                                                           CONCAT12(in_stack_fffffffffffffd92,
                                                                    in_stack_fffffffffffffd90)))))))
  ;
  local_a4 = 1;
  lhs_expression =
       google::
       dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       ::operator->((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)0x1080ddb);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)lhs_expression,
             (char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
             (int *)in_stack_fffffffffffffd98,
             (int *)CONCAT17(in_stack_fffffffffffffd97,
                             CONCAT16(in_stack_fffffffffffffd96,
                                      CONCAT15(in_stack_fffffffffffffd95,
                                               CONCAT14(in_stack_fffffffffffffd94,
                                                        CONCAT13(in_stack_fffffffffffffd93,
                                                                 CONCAT12(in_stack_fffffffffffffd92,
                                                                          in_stack_fffffffffffffd90)
                                                                ))))));
  line = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
  uVar8 = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1080ea2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffdc0,type,(char *)__i,line,
               (char *)CONCAT17(uVar8,in_stack_fffffffffffffda0));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe10,
               (Message *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffffd97,
                        CONCAT16(in_stack_fffffffffffffd96,
                                 CONCAT15(in_stack_fffffffffffffd95,
                                          CONCAT14(in_stack_fffffffffffffd94,
                                                   CONCAT13(in_stack_fffffffffffffd93,
                                                            CONCAT12(in_stack_fffffffffffffd92,
                                                                     in_stack_fffffffffffffd90))))))
              );
    testing::Message::~Message((Message *)0x1080eff);
  }
  local_bc = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1080f6d);
  if (local_bc == 0) {
    std::
    advance<google::dense_hashtable_const_iterator<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>,int>
              (__i,line);
    google::
    dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::cend((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *)CONCAT17(in_stack_fffffffffffffd97,
                       CONCAT16(in_stack_fffffffffffffd96,
                                CONCAT15(in_stack_fffffffffffffd95,
                                         CONCAT14(in_stack_fffffffffffffd94,
                                                  CONCAT13(in_stack_fffffffffffffd93,
                                                           CONCAT12(in_stack_fffffffffffffd92,
                                                                    in_stack_fffffffffffffd90)))))))
    ;
    uVar2 = google::
            dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            ::operator==(&local_90,&local_f0);
    local_d1 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)
               CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffd96,
                                       CONCAT15(in_stack_fffffffffffffd95,
                                                CONCAT14(in_stack_fffffffffffffd94,
                                                         CONCAT13(in_stack_fffffffffffffd93,
                                                                  CONCAT12(in_stack_fffffffffffffd92
                                                                           ,
                                                  in_stack_fffffffffffffd90)))))),
               in_stack_fffffffffffffd88,(type *)0x1080fea);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
    uVar7 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                 (char *)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                 (char *)in_stack_fffffffffffffdf0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdc0,type,(char *)__i,line,
                 (char *)CONCAT17(uVar8,in_stack_fffffffffffffda0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe10,
                 (Message *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffffd95,
                                                        CONCAT14(in_stack_fffffffffffffd94,
                                                                 CONCAT13(in_stack_fffffffffffffd93,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffd92,
                                                  in_stack_fffffffffffffd90)))))));
      std::__cxx11::string::~string(local_120);
      testing::Message::~Message((Message *)0x10810e2);
    }
    local_bc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1081173);
    if (local_bc == 0) {
      google::
      dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::begin((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
               *)CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffffd95,
                                                        CONCAT14(in_stack_fffffffffffffd94,
                                                                 CONCAT13(in_stack_fffffffffffffd93,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffd92,
                                                  in_stack_fffffffffffffd90)))))));
      google::
      dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::dense_hashtable_const_iterator(&local_138,&local_150);
      google::
      dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::end((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *)CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffffd95,
                                                      CONCAT14(in_stack_fffffffffffffd94,
                                                               CONCAT13(in_stack_fffffffffffffd93,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffd92,
                                                  in_stack_fffffffffffffd90)))))));
      google::
      dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::dense_hashtable_const_iterator(&local_168,&local_180);
      google::
      dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::cbegin((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffffd95,
                                                         CONCAT14(in_stack_fffffffffffffd94,
                                                                  CONCAT13(in_stack_fffffffffffffd93
                                                                           ,CONCAT12(
                                                  in_stack_fffffffffffffd92,
                                                  in_stack_fffffffffffffd90)))))));
      uVar3 = google::
              dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
              ::operator==(&local_138,&local_1b0);
      local_191 = uVar3;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)
                 CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffffd94,
                                                                       CONCAT13(
                                                  in_stack_fffffffffffffd93,
                                                  CONCAT12(in_stack_fffffffffffffd92,
                                                           in_stack_fffffffffffffd90)))))),
                 in_stack_fffffffffffffd88,(type *)0x1081238);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
      uVar6 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                   (char *)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                   (char *)in_stack_fffffffffffffdf0);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffdc0,type,(char *)__i,line,
                   (char *)CONCAT17(uVar8,in_stack_fffffffffffffda0));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe10,
                   (Message *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(uVar3,CONCAT14(uVar6,CONCAT13(
                                                  in_stack_fffffffffffffd93,
                                                  CONCAT12(in_stack_fffffffffffffd92,
                                                           in_stack_fffffffffffffd90)))))));
        std::__cxx11::string::~string(local_1e0);
        testing::Message::~Message((Message *)0x1081330);
      }
      local_bc = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10813c1);
      if (local_bc == 0) {
        google::
        dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
        ::cend((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(uVar3,CONCAT14(uVar6,CONCAT13(
                                                  in_stack_fffffffffffffd93,
                                                  CONCAT12(in_stack_fffffffffffffd92,
                                                           in_stack_fffffffffffffd90)))))));
        uVar4 = google::
                dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                ::operator==(&local_168,(const_iterator *)&stack0xfffffffffffffdf0);
        uVar9 = uVar4;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)
                   CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(uVar3,CONCAT14(uVar6,CONCAT13(uVar4,
                                                  CONCAT12(in_stack_fffffffffffffd92,
                                                           in_stack_fffffffffffffd90)))))),
                   in_stack_fffffffffffffd88,(type *)0x1081424);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffffe10);
        if (!bVar1) {
          uVar5 = bVar1;
          testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)CONCAT17(uVar9,in_stack_fffffffffffffe08),
                     (char *)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                     (char *)in_stack_fffffffffffffdf0);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffdc0,type,(char *)__i,line,
                     (char *)CONCAT17(uVar8,in_stack_fffffffffffffda0));
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe10,(Message *)CONCAT17(uVar9,in_stack_fffffffffffffe08))
          ;
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)
                     CONCAT17(uVar2,CONCAT16(uVar7,CONCAT15(uVar3,CONCAT14(uVar6,CONCAT13(uVar4,
                                                  CONCAT12(uVar5,in_stack_fffffffffffffd90)))))));
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
          testing::Message::~Message((Message *)0x1081501);
        }
        local_bc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1081586);
        if (local_bc == 0) {
          local_bc = 0;
        }
      }
    }
  }
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::~dense_hash_map((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)0x10815ab);
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, CBeginCEnd)
{
    dense_hash_map<int, int> h;
    h.set_empty_key(0);
    h.set_deleted_key(-1);

    h[1] = 1;

    auto it = h.cbegin();
    ASSERT_EQ(1, it->first);

    std::advance(it, 1);
    ASSERT_TRUE(it == h.cend());

    using cit = dense_hash_map<int, int>::const_iterator;
    cit begin = h.begin();
    cit end = h.end();
    ASSERT_TRUE(begin == h.cbegin());
    ASSERT_TRUE(end == h.cend());
}